

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_change_meta(lyd_meta *meta,char *val_str)

{
  lys_module *mod;
  char *name;
  LY_ERR LVar1;
  size_t name_len;
  size_t value_len;
  lysc_node *local_90;
  undefined1 local_58 [7];
  ly_bool val_change;
  lyd_value val;
  lyd_meta *m2;
  char *pcStack_20;
  LY_ERR ret;
  char *val_str_local;
  lyd_meta *meta_local;
  
  val.field_2._16_8_ = 0;
  if (meta == (lyd_meta *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","meta","lyd_change_meta");
    meta_local._4_4_ = LY_EINVAL;
  }
  else {
    pcStack_20 = val_str;
    if (val_str == (char *)0x0) {
      pcStack_20 = "";
    }
    mod = meta->annotation->module;
    name = meta->name;
    name_len = strlen(meta->name);
    value_len = strlen(pcStack_20);
    if (meta->parent == (lyd_node *)0x0) {
      local_90 = (lysc_node *)0x0;
    }
    else {
      local_90 = meta->parent->schema;
    }
    m2._4_4_ = lyd_create_meta((lyd_node *)0x0,(lyd_meta **)((long)&val.field_2 + 0x10),mod,name,
                               name_len,pcStack_20,value_len,'\0','\0',(ly_bool *)0x0,LY_VALUE_JSON,
                               (void *)0x0,0x3f3,local_90,'\0',(ly_bool *)0x0);
    if (m2._4_4_ == LY_SUCCESS) {
      LVar1 = lyd_compare_meta(meta,(lyd_meta *)val.field_2._16_8_);
      if (LVar1 == LY_SUCCESS) {
        m2._4_4_ = LY_ENOT;
      }
      else {
        memcpy(local_58,&meta->value,0x28);
        memcpy(&meta->value,(void *)(val.field_2._16_8_ + 0x20),0x28);
        memcpy((void *)(val.field_2._16_8_ + 0x20),local_58,0x28);
      }
    }
    lyd_free_meta_single((lyd_meta *)val.field_2._16_8_);
    meta_local._4_4_ = m2._4_4_;
  }
  return meta_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_change_meta(struct lyd_meta *meta, const char *val_str)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_meta *m2 = NULL;
    struct lyd_value val;
    ly_bool val_change;

    LY_CHECK_ARG_RET(NULL, meta, LY_EINVAL);

    if (!val_str) {
        val_str = "";
    }

    /* parse the new value into a new meta structure */
    ret = lyd_create_meta(NULL, &m2, meta->annotation->module, meta->name, strlen(meta->name), val_str, strlen(val_str),
            0, 0, NULL, LY_VALUE_JSON, NULL, LYD_HINT_DATA, meta->parent ? meta->parent->schema : NULL, 0, NULL);
    LY_CHECK_GOTO(ret, cleanup);

    /* compare original and new value */
    if (lyd_compare_meta(meta, m2)) {
        /* values differ, switch them */
        val = meta->value;
        meta->value = m2->value;
        m2->value = val;
        val_change = 1;
    } else {
        val_change = 0;
    }

    /* retrun value */
    if (!val_change) {
        /* no change */
        ret = LY_ENOT;
    } /* else value changed, LY_SUCCESS */

cleanup:
    lyd_free_meta_single(m2);
    return ret;
}